

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest_LimitingInputStream_Test::TestBody
          (IoTest_LimitingInputStream_Test *this)

{
  int64_t limit;
  undefined1 local_188 [8];
  LimitingInputStream input;
  ArrayInputStream array_input;
  undefined1 local_138 [8];
  ArrayOutputStream output;
  uint8_t buffer [256];
  int kBufferSize;
  IoTest_LimitingInputStream_Test *this_local;
  
  ArrayOutputStream::ArrayOutputStream((ArrayOutputStream *)local_138,&output.position_,0x100,-1);
  IoTest::WriteStuff(&this->super_IoTest,(ZeroCopyOutputStream *)local_138);
  ArrayInputStream::ArrayInputStream
            ((ArrayInputStream *)&input.prior_bytes_read_,&output.position_,0x100,-1);
  limit = ArrayOutputStream::ByteCount((ArrayOutputStream *)local_138);
  LimitingInputStream::LimitingInputStream
            ((LimitingInputStream *)local_188,(ZeroCopyInputStream *)&input.prior_bytes_read_,limit)
  ;
  IoTest::ReadStuff(&this->super_IoTest,(ZeroCopyInputStream *)local_188,true);
  LimitingInputStream::~LimitingInputStream((LimitingInputStream *)local_188);
  ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&input.prior_bytes_read_);
  ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)local_138);
  return;
}

Assistant:

TEST_F(IoTest, LimitingInputStream) {
  const int kBufferSize = 256;
  uint8_t buffer[kBufferSize];

  // Fill the buffer.
  ArrayOutputStream output(buffer, kBufferSize);
  WriteStuff(&output);

  // Set up input.
  ArrayInputStream array_input(buffer, kBufferSize);
  LimitingInputStream input(&array_input, output.ByteCount());

  ReadStuff(&input);
}